

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.c
# Opt level: O2

int ply_read_header_obj_info(p_ply ply)

{
  int iVar1;
  
  if ((ply->fp != (FILE *)0x0) && (ply->io_mode == PLY_READ)) {
    iVar1 = strcmp(ply->buffer + ply->buffer_token,"obj_info");
    if (iVar1 == 0) {
      iVar1 = ply_read_line(ply);
      if (iVar1 != 0) {
        iVar1 = ply_add_obj_info(ply,ply->buffer + ply->buffer_token);
        if (iVar1 != 0) {
          iVar1 = ply_read_word(ply);
          return iVar1;
        }
      }
    }
    return 0;
  }
  __assert_fail("ply && ply->fp && ply->io_mode == PLY_READ",
                "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/rply/rply.c"
                ,0x4c7,"int ply_read_header_obj_info(p_ply)");
}

Assistant:

static int ply_read_header_obj_info(p_ply ply) {
    assert(ply && ply->fp && ply->io_mode == PLY_READ);
    if (strcmp(BWORD(ply), "obj_info")) return 0;
    if (!ply_read_line(ply)) return 0;
    if (!ply_add_obj_info(ply, BLINE(ply))) return 0;
    if (!ply_read_word(ply)) return 0;
    return 1;
}